

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O3

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrFoveationConfigurationHTC *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  bool bVar3;
  char *pcVar4;
  undefined7 in_register_00000009;
  long lVar5;
  XrResult XVar6;
  undefined7 in_register_00000081;
  string out;
  ostringstream oss_enum;
  string local_200;
  string local_1e0;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1c0;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  XVar6 = XR_SUCCESS;
  if ((int)CONCAT71(in_register_00000009,check_members) != 0) {
    local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"XrFoveationConfigurationHTC","",
               CONCAT71(in_register_00000009,check_members),
               CONCAT71(in_register_00000081,check_pnext));
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"level","");
    bVar3 = ValidateXrEnum(instance_info,command_name,local_1a8,&local_200,objects_info,value->level
                          );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    XVar6 = XR_SUCCESS;
    if (!bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "XrFoveationConfigurationHTC contains invalid XrFoveationLevelHTC \"level\" enum value "
                 ,0x54);
      local_1e0._M_dataplus._M_p._0_4_ = value->level;
      paVar1 = &local_200.field_2;
      local_200._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct((ulong)&local_200,'\n');
      *local_200._M_dataplus._M_p = '0';
      local_200._M_dataplus._M_p[1] = 'x';
      pcVar4 = local_200._M_dataplus._M_p + (local_200._M_string_length - 1);
      lVar5 = 0;
      do {
        bVar2 = *(byte *)((long)&local_1e0._M_dataplus._M_p + lVar5);
        *pcVar4 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 & 0xf];
        pcVar4[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 >> 4];
        lVar5 = lVar5 + 1;
        pcVar4 = pcVar4 + -2;
      } while (lVar5 != 4);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,local_200._M_dataplus._M_p,local_200._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != paVar1) {
        operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
      }
      local_200._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_200,"VUID-XrFoveationConfigurationHTC-level-parameter","");
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_1c0,objects_info);
      std::__cxx11::stringbuf::str();
      CoreValidLogMessage(instance_info,&local_200,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                          &local_1c0,&local_1e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_1e0._M_dataplus._M_p._4_4_,
                      (XrFoveationLevelHTC)local_1e0._M_dataplus._M_p) != &local_1e0.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_1e0._M_dataplus._M_p._4_4_,
                                 (XrFoveationLevelHTC)local_1e0._M_dataplus._M_p),
                        local_1e0.field_2._M_allocated_capacity + 1);
      }
      if (local_1c0.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1c0.
                        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_1c0.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1c0.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != paVar1) {
        operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      XVar6 = XR_ERROR_VALIDATION_FAILURE;
    }
  }
  return XVar6;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrFoveationConfigurationHTC* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Make sure the enum type XrFoveationLevelHTC value is valid
    if (!ValidateXrEnum(instance_info, command_name, "XrFoveationConfigurationHTC", "level", objects_info, value->level)) {
        std::ostringstream oss_enum;
        oss_enum << "XrFoveationConfigurationHTC contains invalid XrFoveationLevelHTC \"level\" enum value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->level));
        CoreValidLogMessage(instance_info, "VUID-XrFoveationConfigurationHTC-level-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Everything checked out properly
    return xr_result;
}